

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_score.cc
# Opt level: O2

void __thiscall
xLearn::FMScore::calc_grad_sgd(FMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  float fVar6;
  index_t d_1;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  ulong __n;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar17 [16];
  vector<float,_std::allocator<float>_> sv;
  allocator_type local_75;
  real_t local_74;
  real_t local_70;
  value_type_conflict1 local_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  _Vector_base<float,_std::allocator<float>_> local_48;
  
  auVar17 = in_ZMM4._0_16_;
  auVar15._4_60_ = in_register_00001244;
  auVar15._0_4_ = norm;
  auVar13._4_60_ = in_register_00001204;
  auVar13._0_4_ = pg;
  auVar12 = auVar13._0_16_;
  local_74 = pg;
  local_70 = norm;
  if (norm < 0.0) {
    fVar11 = sqrtf(norm);
    auVar12 = ZEXT416((uint)local_74);
  }
  else {
    auVar16 = vsqrtss_avx(auVar15._0_16_,auVar15._0_16_);
    fVar11 = auVar16._0_4_;
  }
  lVar8 = *(long *)(model + 0x58);
  uVar3 = *(uint *)(model + 0x48);
  lVar5 = *(long *)(row + 8);
  for (lVar7 = *(long *)row; lVar7 != lVar5; lVar7 = lVar7 + 0xc) {
    uVar4 = *(uint *)(lVar7 + 4);
    if (uVar4 < uVar3) {
      auVar14 = ZEXT416(*(uint *)(lVar8 + (ulong)uVar4 * 4));
      auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * auVar12._0_4_ * *(float *)(lVar7 + 8))),
                                auVar14,ZEXT416((uint)(this->super_Score).regu_lambda_));
      auVar16 = vfnmadd132ss_fma(auVar16,auVar14,ZEXT416((uint)(this->super_Score).learning_rate_));
      *(int *)(lVar8 + (ulong)uVar4 * 4) = auVar16._0_4_;
    }
  }
  auVar12 = vfnmadd213ss_fma(ZEXT416((uint)(this->super_Score).learning_rate_),auVar12,
                             ZEXT416(**(uint **)(model + 0x68)));
  **(uint **)(model + 0x68) = auVar12._0_4_;
  auVar12 = vcvtusi2ss_avx512f(auVar17,*(undefined4 *)(model + 0x50));
  local_58._0_4_ = (this->super_Score).learning_rate_;
  local_58._4_4_ = (this->super_Score).regu_lambda_;
  local_58._8_4_ = (this->super_Score).alpha_;
  local_58._12_4_ = (this->super_Score).beta_;
  auVar12 = ZEXT416((uint)(auVar12._0_4_ * 0.25));
  auVar12 = vroundss_avx(auVar12,auVar12,10);
  iVar10 = vcvttss2usi_avx512f(auVar12);
  __n = (ulong)(uint)(iVar10 << 2);
  auVar12 = vcvtusi2ss_avx512f(auVar17,iVar10 << 2);
  auVar17 = vcvtusi2ss_avx512f(auVar17,*(undefined4 *)(model + 0x54));
  local_68._0_4_ = (this->super_Score).regu_lambda_;
  local_68._4_4_ = (this->super_Score).alpha_;
  local_68._8_4_ = (this->super_Score).beta_;
  local_68._12_4_ = (this->super_Score).lambda_1_;
  local_6c = 0.0;
  iVar10 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar17._0_4_ * auVar12._0_4_)));
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_48,__n,&local_6c,&local_75);
  for (lVar8 = *(long *)row; lVar8 != *(long *)(row + 8); lVar8 = lVar8 + 0xc) {
    uVar4 = *(uint *)(lVar8 + 4);
    if (uVar4 < uVar3) {
      fVar11 = local_70 * *(float *)(lVar8 + 8);
      lVar7 = *(long *)(model + 0x60);
      for (uVar9 = 0; uVar9 < __n; uVar9 = uVar9 + 4) {
        pfVar1 = (float *)((ulong)(uVar4 * iVar10) * 4 + lVar7 + uVar9 * 4);
        pfVar2 = local_48._M_impl.super__Vector_impl_data._M_start + uVar9;
        auVar12._0_4_ = fVar11 * *pfVar1 + *pfVar2;
        auVar12._4_4_ = fVar11 * pfVar1[1] + pfVar2[1];
        auVar12._8_4_ = fVar11 * pfVar1[2] + pfVar2[2];
        auVar12._12_4_ = fVar11 * pfVar1[3] + pfVar2[3];
        *(undefined1 (*) [16])(local_48._M_impl.super__Vector_impl_data._M_start + uVar9) = auVar12;
      }
    }
  }
  for (lVar7 = *(long *)row; lVar7 != lVar8; lVar7 = lVar7 + 0xc) {
    if (*(uint *)(lVar7 + 4) < uVar3) {
      fVar11 = local_70 * *(float *)(lVar7 + 8);
      lVar8 = (ulong)(*(uint *)(lVar7 + 4) * iVar10) * 4 + *(long *)(model + 0x60);
      fVar6 = local_74 * fVar11;
      for (uVar9 = 0; uVar9 < __n; uVar9 = uVar9 + 4) {
        auVar12 = *(undefined1 (*) [16])(lVar8 + uVar9 * 4);
        auVar17._0_4_ = fVar11 * auVar12._0_4_;
        auVar17._4_4_ = fVar11 * auVar12._4_4_;
        auVar17._8_4_ = fVar11 * auVar12._8_4_;
        auVar17._12_4_ = fVar11 * auVar12._12_4_;
        auVar17 = vsubps_avx(*(undefined1 (*) [16])
                              (local_48._M_impl.super__Vector_impl_data._M_start + uVar9),auVar17);
        auVar16._0_4_ =
             (float)local_58._0_4_ * ((float)local_68._0_4_ * auVar12._0_4_ + fVar6 * auVar17._0_4_)
        ;
        auVar16._4_4_ =
             (float)local_58._0_4_ * ((float)local_68._0_4_ * auVar12._4_4_ + fVar6 * auVar17._4_4_)
        ;
        auVar16._8_4_ =
             (float)local_58._0_4_ * ((float)local_68._0_4_ * auVar12._8_4_ + fVar6 * auVar17._8_4_)
        ;
        auVar16._12_4_ =
             (float)local_58._0_4_ *
             ((float)local_68._0_4_ * auVar12._12_4_ + fVar6 * auVar17._12_4_);
        auVar12 = vsubps_avx(auVar12,auVar16);
        *(undefined1 (*) [16])(lVar8 + uVar9 * 4) = auVar12;
      }
      lVar8 = *(long *)(row + 8);
    }
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void FMScore::calc_grad_sgd(const SparseRow* row,
                            Model& model,
                            real_t pg,
                            real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/  
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id];
    real_t g = regu_lambda_*wl+pg*iter->feat_val*sqrt_norm;
    wl -= learning_rate_ * g;
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t g = pg;
  wb -= learning_rate_ * g;
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t aligned_k = model.get_aligned_k();
  index_t align0 = model.get_aligned_k() * 
                   model.GetAuxiliarySize();
  __m128 XMMpg = _mm_set1_ps(pg);
  __m128 XMMlr = _mm_set1_ps(learning_rate_);
  __m128 XMMlamb = _mm_set1_ps(regu_lambda_);
  std::vector<real_t> sv(aligned_k, 0);
  real_t* s = sv.data();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    for (index_t d = 0; d < aligned_k; d += kAlign) {
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 const XMMw = _mm_load_ps(w+d);
      XMMs = _mm_add_ps(XMMs, _mm_mul_ps(XMMw, XMMv));
      _mm_store_ps(s+d, XMMs);
    }
  }
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
  // To avoid unseen feature
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    __m128 XMMpgv = _mm_mul_ps(XMMpg, XMMv);
    for(index_t d = 0; d < aligned_k; d += kAlign) {
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 XMMw = _mm_load_ps(w+d);
      __m128 XMMg = _mm_add_ps(_mm_mul_ps(XMMlamb, XMMw),
        _mm_mul_ps(XMMpgv, _mm_sub_ps(XMMs,
        _mm_mul_ps(XMMw, XMMv))));
      XMMw = _mm_sub_ps(XMMw, _mm_mul_ps(XMMlr, XMMg));
      _mm_store_ps(w+d, XMMw);
    }
  }
}